

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::base64_encode(string *in)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  undefined8 in_RSI;
  char cVar4;
  string *in_RDI;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  int valb;
  int val;
  string *out;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  string *__lhs;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined8 local_38;
  int local_2c;
  int local_28;
  undefined1 local_11;
  undefined8 local_10;
  
  local_11 = 0;
  __lhs = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string((string *)in_RDI);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)in_RDI);
  local_28 = 0;
  local_2c = -6;
  local_38 = local_10;
  local_40._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)__lhs,in_stack_ffffffffffffff98);
    cVar4 = (char)in_RDI;
    if (!bVar1) break;
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_40);
    local_28 = local_28 * 0x100 + (uint)*pbVar2;
    for (local_2c = local_2c + 8; -1 < local_2c; local_2c = local_2c + -6) {
      std::__cxx11::string::push_back(cVar4);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_40);
  }
  if (-6 < local_2c) {
    std::__cxx11::string::push_back(cVar4);
  }
  while (uVar3 = std::__cxx11::string::size(), (uVar3 & 3) != 0) {
    std::__cxx11::string::push_back(cVar4);
  }
  return __lhs;
}

Assistant:

inline std::string base64_encode(const std::string& in) {
            static const auto lookup =
                "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";

            std::string out;
            out.reserve(in.size());

            int val = 0;
            int valb = -6;

            for (auto c : in) {
                val = (val << 8) + static_cast<uint8_t>(c);
                valb += 8;
                while (valb >= 0) {
                    out.push_back(lookup[(val >> valb) & 0x3F]);
                    valb -= 6;
                }
            }

            if (valb > -6) { out.push_back(lookup[((val << 8) >> (valb + 8)) & 0x3F]); }

            while (out.size() % 4) {
                out.push_back('=');
            }

            return out;
        }